

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AddTwiceListedError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar1;
  string_view element_name;
  int local_3c;
  VoidPtr local_38;
  code *pcStack_30;
  FileDescriptorProto *local_28;
  int *local_20;
  
  local_3c = index;
  pVVar1 = internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                     (&(proto->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase,index);
  local_38.obj = &local_28;
  pcStack_30 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::AddTwiceListedError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
  ;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::AddTwiceListedError(google::protobuf::FileDescriptorProto_const&,int)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = local_38.obj;
  element_name._M_str = (pVVar1->_M_dataplus)._M_p;
  element_name._M_len = pVVar1->_M_string_length;
  local_28 = proto;
  local_20 = &local_3c;
  AddError(this,element_name,&proto->super_Message,IMPORT,make_error);
  return;
}

Assistant:

void DescriptorBuilder::AddTwiceListedError(const FileDescriptorProto& proto,
                                            int index) {
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, [&] {
             return absl::StrCat("Import \"", proto.dependency(index),
                                 "\" was listed twice.");
           });
}